

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_dictionary.hpp
# Opt level: O0

bool __thiscall
ArgumentDictionary::get_boolean(ArgumentDictionary *this,string *name,bool default_value)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *__str;
  out_of_range *anon_var_0;
  string contents;
  undefined1 local_48 [8];
  string negation_param;
  bool default_value_local;
  string *name_local;
  ArgumentDictionary *this_local;
  
  negation_param.field_2._M_local_buf[0xf] = default_value;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,"no",
                 name);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&this->_args_map,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  if (sVar2 == 0) {
    __str = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at(&this->_args_map,name);
    std::__cxx11::string::string((string *)&anon_var_0,__str);
    stringtools::to_lower((string *)&anon_var_0);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &anon_var_0,"false");
    this_local._7_1_ = !bVar1;
    contents.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)&anon_var_0);
  }
  else {
    this_local._7_1_ = false;
    contents.field_2._8_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

[[nodiscard]] bool get_boolean(const std::string& name, bool default_value = false) const
    {
        // "--noParam" <==> "--param=false"
        std::string negation_param = "no" + name;
        if (_args_map.count(negation_param))
            return false;

        try {
            std::string contents = _args_map.at(name);
            stringtools::to_lower(contents);

            // "--param=false"
            if (contents == "false")
                return false;

            // "--param=true" or "--param"
            return true;
        } catch (std::out_of_range&) {
            // No trace of "--param" or "--noParam", return default value
            return default_value;
        }
    }